

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageTexelBuffer::prepare
          (RenderVertexStorageTexelBuffer *this,PrepareRenderPassContext *context)

{
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_> *this_00;
  VkDescriptorPool *pVVar1;
  VkRenderPass renderPass;
  Context *pCVar2;
  InstanceInterface *vk;
  DeviceInterface *deviceInterface;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  VkDescriptorPool obj;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  VkResult result;
  const_iterator cVar6;
  ulong uVar7;
  PipelineResources *in_stack_fffffffffffffbc8;
  VkDescriptorSetAllocateInfo allocateInfo;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorPoolSize poolSizes;
  Move<vk::Handle<(vk::HandleType)21>_> local_3c8;
  VkShaderModule local_3a8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3a0;
  VkShaderModule local_388;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_380;
  VkDescriptorSetLayoutBinding binding;
  deUint32 local_22c;
  
  renderPass.m_internal = (context->m_renderPass).m_internal;
  pCVar2 = context->m_context->m_context;
  vk = pCVar2->m_vki;
  deviceInterface = pCVar2->m_vkd;
  physicalDevice = pCVar2->m_physicalDevice;
  device = pCVar2->m_device;
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_context->m_context->m_binaryCollection;
  pVVar1 = &allocateInfo.descriptorPool;
  allocateInfo._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&allocateInfo,"storage-texel-buffer.vert","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,
             *(ProgramBinary **)(cVar6._M_node + 2),0);
  DStack_380.m_device = (VkDevice)binding.pImmutableSamplers;
  local_388.m_internal._0_4_ = binding.binding;
  local_388.m_internal._4_4_ = binding.descriptorType;
  DStack_380.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  if ((VkDescriptorPool *)allocateInfo._0_8_ != pVVar1) {
    operator_delete((void *)allocateInfo._0_8_,allocateInfo.descriptorPool.m_internal + 1);
  }
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_context->m_context->m_binaryCollection;
  allocateInfo._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&allocateInfo,"render-white.frag","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,
             *(ProgramBinary **)(cVar6._M_node + 2),0);
  DStack_3a0.m_device = (VkDevice)binding.pImmutableSamplers;
  DStack_3a0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3a8.m_internal._0_4_ = binding.binding;
  local_3a8.m_internal._4_4_ = binding.descriptorType;
  DStack_3a0.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  if ((VkDescriptorPool *)allocateInfo._0_8_ != pVVar1) {
    operator_delete((void *)allocateInfo._0_8_,allocateInfo.descriptorPool.m_internal + 1);
  }
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_device = device;
  this->m_vkd = deviceInterface;
  this->m_bufferSize = context->m_context->m_currentBufferSize;
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)&binding,vk,physicalDevice);
  this->m_maxStorageTexelCount = local_22c;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
  binding.descriptorCount = 1;
  binding.stageFlags = 1;
  if (bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>::
    _M_realloc_insert<vk::VkDescriptorSetLayoutBinding_const&>
              ((vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>
                *)&bindings,
               (iterator)
               bindings.
               super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish,&binding);
  }
  else {
    (bindings.
     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->pImmutableSamplers = (VkSampler *)0x0;
    (bindings.
     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->binding = 0;
    (bindings.
     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->descriptorType =
         VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
    (bindings.
     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->descriptorCount = 1;
    (bindings.
     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->stageFlags = 1;
    bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  binding.pImmutableSamplers = (VkSampler *)0x0;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  allocateInfo.descriptorPool.m_internal = 0;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  allocateInfo.pNext = (void *)0x0;
  createPipelineWithResources
            (deviceInterface,device,renderPass,(deUint32)&local_388,&local_3a8,
             (VkShaderModule *)(ulong)(uint)context->m_targetWidth,context->m_targetHeight,
             (deUint32)(VkPhysicalDeviceProperties *)&binding,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)&allocateInfo,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)&bindings,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)0x0,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)&this->m_resources,
             in_stack_fffffffffffffbc8);
  if (allocateInfo._0_8_ != 0) {
    operator_delete((void *)allocateInfo._0_8_,
                    allocateInfo.descriptorPool.m_internal - allocateInfo._0_8_);
  }
  if (binding._0_8_ != 0) {
    operator_delete((void *)binding._0_8_,(long)binding.pImmutableSamplers - binding._0_8_);
  }
  auVar4 = ZEXT416(this->m_maxStorageTexelCount) << 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->m_bufferSize;
  uVar7 = (SUB168(auVar5 / auVar4,0) + 1) - (ulong)(SUB168(auVar5 % auVar4,0) == 0);
  poolSizes.descriptorCount = (deUint32)uVar7;
  poolSizes.type = VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
  binding.binding = 0x21;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)CONCAT44(poolSizes.descriptorCount,1);
  ::vk::createDescriptorPool
            (&local_3c8,deviceInterface,device,(VkDescriptorPoolCreateInfo *)&binding,
             (VkAllocationCallbacks *)0x0);
  allocateInfo.descriptorPool.m_internal =
       (deUint64)local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  allocateInfo._24_8_ =
       local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  allocateInfo._0_8_ =
       local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  allocateInfo.pNext =
       local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
  }
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)allocateInfo.descriptorPool.m_internal;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)allocateInfo._24_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       allocateInfo._0_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)allocateInfo.pNext;
  if (local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
               (VkDescriptorPool)
               local_3c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
  }
  this_00 = &this->m_descriptorSets;
  uVar7 = uVar7 & 0xffffffff;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
  resize(this_00,uVar7,(value_type *)&allocateInfo);
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  std::vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
  resize(&this->m_bufferViews,uVar7,(value_type *)&allocateInfo);
  if ((this->m_descriptorSets).
      super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_descriptorSets).
      super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      poolSizes = (VkDescriptorPoolSize)
                  (this->m_resources).descriptorSetLayout.
                  super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
      allocateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
      allocateInfo.pNext = (void *)0x0;
      allocateInfo.descriptorPool.m_internal =
           (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
           m_internal;
      allocateInfo.descriptorSetCount = 1;
      allocateInfo.pSetLayouts = (VkDescriptorSetLayout *)&poolSizes;
      ::vk::allocateDescriptorSet
                ((Move<vk::Handle<(vk::HandleType)22>_> *)&binding,deviceInterface,device,
                 &allocateInfo);
      (this_00->
      super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar7].m_internal = binding._0_8_;
      binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
      binding.binding = 0xd;
      binding.descriptorCount = 0;
      binding.stageFlags = 0;
      binding.pImmutableSamplers = (VkSampler *)0x0;
      result = (*deviceInterface->_vptr_DeviceInterface[0x23])
                         (deviceInterface,device,&binding,0,
                          (this->m_bufferViews).
                          super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar7);
      ::vk::checkResult(result,
                        "vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                        ,0x1618);
      binding.binding = 0x23;
      binding.descriptorCount = 0;
      binding.stageFlags = 0;
      binding.pImmutableSamplers =
           (VkSampler *)
           (this_00->
           super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar7].m_internal;
      (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device,1,&binding,0,0);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(this->m_descriptorSets).
                                   super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_descriptorSets).
                                   super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_3a0,local_3a8);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_380,local_388);
  }
  return;
}

Assistant:

void RenderVertexStorageTexelBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::InstanceInterface&				vki						= context.getContext().getInstanceInterface();
	const vk::VkPhysicalDevice					physicalDevice			= context.getContext().getPhysicalDevice();
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-texel-buffer.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	m_device				= device;
	m_vkd					= &vkd;
	m_bufferSize			= context.getBufferSize();
	m_maxStorageTexelCount	= vk::getPhysicalDeviceProperties(vki, physicalDevice).limits.maxTexelBufferElements;

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
			1,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	{
		const deUint32							descriptorCount	= (deUint32)(divRoundUp(m_bufferSize, (vk::VkDeviceSize)m_maxStorageTexelCount * 4));
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
			descriptorCount
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			descriptorCount,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
		m_descriptorSets.resize(descriptorCount, (vk::VkDescriptorSet)0);
		m_bufferViews.resize(descriptorCount, (vk::VkBufferView)0);
	}

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSets[descriptorSetNdx] = vk::allocateDescriptorSet(vkd, device, &allocateInfo).disown();

		{
			const vk::VkBufferViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getBuffer(),
				vk::VK_FORMAT_R32_UINT,
				descriptorSetNdx * m_maxStorageTexelCount * 4,
				(deUint32)de::min<vk::VkDeviceSize>(m_maxStorageTexelCount * 4, m_bufferSize - descriptorSetNdx * m_maxStorageTexelCount * 4)
			};

			VK_CHECK(vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx]));
		}

		{
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				m_descriptorSets[descriptorSetNdx],
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
				DE_NULL,
				DE_NULL,
				&m_bufferViews[descriptorSetNdx]
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}